

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fRboStateQueryTests.cpp
# Opt level: O1

void __thiscall
deqp::gles3::Functional::anon_unknown_1::RboComponentSizeDepthCase::test
          (RboComponentSizeDepthCase *this)

{
  CallLogWrapper *this_00;
  ostringstream *this_01;
  int d;
  TestContext *this_02;
  bool bVar1;
  long lVar2;
  GLuint renderbufferID;
  StateQueryMemoryWriteGuard<int> state;
  undefined1 local_1a8 [120];
  ios_base local_130 [264];
  
  renderbufferID = 0;
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&renderbufferID);
  glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,renderbufferID);
  lVar2 = 0;
  ApiCase::expectError(&this->super_ApiCase,0);
  do {
    d = *(int *)((long)&DAT_01c51614 + lVar2);
    glu::CallLogWrapper::glRenderbufferStorage
              (this_00,0x8d41,*(GLenum *)((long)&DAT_01c51610 + lVar2),0x80,0x80);
    ApiCase::expectError(&this->super_ApiCase,0);
    checkRenderbufferComponentSize
              ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,this_00,
               -1,-1,-1,-1,d,*(int *)((long)&DAT_01c51618 + lVar2));
    lVar2 = lVar2 + 0xc;
  } while (lVar2 != 0x3c);
  glu::CallLogWrapper::glRenderbufferStorage(this_00,0x8d41,0x8d48,0x80,0x80);
  ApiCase::expectError(&this->super_ApiCase,0);
  state.m_preguard = -0x21212122;
  state.m_value = -0x21212122;
  state.m_postguard = -0x21212122;
  glu::CallLogWrapper::glGetRenderbufferParameteriv(this_00,0x8d41,0x8d55,&state.m_value);
  bVar1 = deqp::gls::StateQueryUtil::StateQueryMemoryWriteGuard<int>::verifyValidity
                    (&state,(this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.
                            m_testCtx);
  if ((bVar1) && (state.m_value < 8)) {
    local_1a8._0_8_ =
         ((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->m_log;
    this_01 = (ostringstream *)(local_1a8 + 8);
    std::__cxx11::ostringstream::ostringstream(this_01);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_01,"// ERROR: Expected greater or equal to 8; got ",0x2e);
    std::ostream::operator<<(this_01,state.m_value);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1a8,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_01);
    std::ios_base::~ios_base(local_130);
    this_02 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    if (this_02->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this_02,QP_TEST_RESULT_FAIL,"got invalid value");
    }
  }
  glu::CallLogWrapper::glDeleteRenderbuffers(this_00,1,&renderbufferID);
  return;
}

Assistant:

void test (void)
	{
		using tcu::TestLog;

		GLuint renderbufferID = 0;
		glGenRenderbuffers(1, &renderbufferID);
		glBindRenderbuffer(GL_RENDERBUFFER, renderbufferID);
		expectError(GL_NO_ERROR);

		const struct DepthFormat
		{
			GLenum	internalFormat;
			int		dbits;
			int		sbits;
		} requiredDepthFormats[] =
		{
			{ GL_DEPTH_COMPONENT16,		16, 0 },
			{ GL_DEPTH_COMPONENT24,		24, 0 },
			{ GL_DEPTH_COMPONENT32F,	32, 0 },
			{ GL_DEPTH24_STENCIL8,		24, 8 },
			{ GL_DEPTH32F_STENCIL8,		32, 8 },
		};

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(requiredDepthFormats); ++ndx)
		{
			glRenderbufferStorage(GL_RENDERBUFFER, requiredDepthFormats[ndx].internalFormat, 128, 128);
			expectError(GL_NO_ERROR);

			checkRenderbufferComponentSize(m_testCtx, *this, -1, -1, -1, -1, requiredDepthFormats[ndx].dbits, requiredDepthFormats[ndx].sbits);
		}

		// STENCIL_INDEX8 is required, in that case sBits >= 8
		{
			glRenderbufferStorage(GL_RENDERBUFFER, GL_STENCIL_INDEX8, 128, 128);
			expectError(GL_NO_ERROR);

			StateQueryMemoryWriteGuard<GLint> state;
			glGetRenderbufferParameteriv(GL_RENDERBUFFER, GL_RENDERBUFFER_STENCIL_SIZE, &state);

			if (state.verifyValidity(m_testCtx) && state < 8)
			{
				m_testCtx.getLog() << TestLog::Message << "// ERROR: Expected greater or equal to 8; got " << state << TestLog::EndMessage;
				if (m_testCtx.getTestResult() == QP_TEST_RESULT_PASS)
					m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "got invalid value");
			}
		}

		glDeleteRenderbuffers(1, &renderbufferID);
	}